

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O3

void fetchTransformed_fetcher<(TextureBlendType)3,(QPixelLayout::BPP)6,unsigned_int>
               (uint *buffer,QSpanData *data,int y,int x,int length)

{
  uint *puVar1;
  uint uVar2;
  uchar *puVar3;
  long lVar4;
  double dVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double local_a8;
  double dStack_a0;
  
  dVar14 = (double)x + 0.5;
  dVar17 = (double)y + 0.5;
  if ((data->field_0x8a & 1) == 0) {
    local_a8 = data->m11;
    dStack_a0 = data->m12;
  }
  else {
    local_a8 = data->m11;
    dStack_a0 = data->m12;
    dVar18 = (dVar17 * data->m21 + dVar14 * local_a8 + data->dx) * 65536.0;
    dVar19 = (dVar17 * data->m22 + dVar14 * dStack_a0 + data->dy) * 65536.0;
    dVar13 = dVar19;
    if (dVar18 <= dVar19) {
      dVar13 = dVar18;
    }
    dVar5 = trunc(local_a8 * 65536.0);
    dVar16 = trunc(dStack_a0 * 65536.0);
    dVar15 = (double)length * dVar5 + dVar18;
    dVar16 = (double)length * dVar16 + dVar19;
    dVar5 = dVar16;
    if (dVar15 <= dVar16) {
      dVar5 = dVar15;
    }
    if (dVar13 <= dVar5) {
      dVar5 = dVar13;
    }
    if (-2147483648.0 <= dVar5) {
      dVar13 = dVar19;
      if (dVar19 <= dVar18) {
        dVar13 = dVar18;
      }
      if (dVar16 <= dVar15) {
        dVar16 = dVar15;
      }
      if (dVar16 <= dVar13) {
        dVar16 = dVar13;
      }
      if (dVar16 <= 2147483647.0) {
        iVar11 = (int)(local_a8 * 65536.0);
        iVar12 = (int)(dStack_a0 * 65536.0);
        iVar6 = (int)dVar18;
        iVar8 = (int)dVar19;
        if (iVar12 != 0) {
          if (length < 1) {
            return;
          }
          puVar3 = (data->field_23).texture.imageData;
          lVar4 = (data->field_23).texture.bytesPerLine;
          uVar10 = 0;
          do {
            iVar9 = iVar6 >> 0x10;
            uVar2 = (data->field_23).texture.width;
            if (iVar9 < 0 || (int)uVar2 <= iVar9) {
              iVar9 = (iVar9 % (int)uVar2 >> 0x1f & uVar2) + iVar9 % (int)uVar2;
            }
            iVar7 = iVar8 >> 0x10;
            uVar2 = (data->field_23).texture.height;
            if (iVar7 < 0 || (int)uVar2 <= iVar7) {
              iVar7 = (iVar7 % (int)uVar2 >> 0x1f & uVar2) + iVar7 % (int)uVar2;
            }
            buffer[uVar10] = *(uint *)(puVar3 + (long)iVar9 * 4 + iVar7 * lVar4);
            iVar6 = iVar6 + iVar11;
            iVar8 = iVar8 + iVar12;
            uVar10 = uVar10 + 1;
          } while ((uint)length != uVar10);
          return;
        }
        iVar8 = iVar8 >> 0x10;
        uVar2 = (data->field_23).texture.height;
        if (iVar8 < 0 || (int)uVar2 <= iVar8) {
          iVar8 = (iVar8 % (int)uVar2 >> 0x1f & uVar2) + iVar8 % (int)uVar2;
        }
        if (length < 1) {
          return;
        }
        lVar4 = (data->field_23).texture.bytesPerLine;
        puVar3 = (data->field_23).texture.imageData;
        uVar10 = 0;
        do {
          iVar12 = iVar6 >> 0x10;
          uVar2 = (data->field_23).texture.width;
          if (iVar12 < 0 || (int)uVar2 <= iVar12) {
            iVar12 = (iVar12 % (int)uVar2 >> 0x1f & uVar2) + iVar12 % (int)uVar2;
          }
          buffer[uVar10] = *(uint *)(puVar3 + (long)iVar12 * 4 + iVar8 * lVar4);
          iVar6 = iVar6 + iVar11;
          uVar10 = uVar10 + 1;
        } while ((uint)length != uVar10);
        return;
      }
    }
  }
  if (0 < length) {
    dVar13 = data->m13;
    puVar1 = buffer + length;
    dVar18 = data->m23 * dVar17 + dVar14 * dVar13 + data->m33;
    dVar19 = data->dx + data->m21 * dVar17 + dVar14 * local_a8;
    dVar14 = data->dy + data->m22 * dVar17 + dVar14 * dStack_a0;
    puVar3 = (data->field_23).texture.imageData;
    lVar4 = (data->field_23).texture.bytesPerLine;
    do {
      dVar5 = (double)(-(ulong)(dVar18 == 0.0) & 0x3ff0000000000000 |
                      ~-(ulong)(dVar18 == 0.0) & (ulong)(1.0 / dVar18));
      dVar17 = floor(dVar19 * dVar5);
      dVar5 = floor(dVar14 * dVar5);
      iVar8 = (int)dVar5;
      uVar2 = (data->field_23).texture.height;
      if (iVar8 < 0 || (int)uVar2 <= iVar8) {
        iVar8 = (iVar8 % (int)uVar2 >> 0x1f & uVar2) + iVar8 % (int)uVar2;
      }
      iVar6 = (int)dVar17;
      uVar2 = (data->field_23).texture.width;
      if (iVar6 < 0 || (int)uVar2 <= iVar6) {
        iVar6 = (iVar6 % (int)uVar2 >> 0x1f & uVar2) + iVar6 % (int)uVar2;
      }
      *buffer = *(uint *)(puVar3 + (long)iVar6 * 4 + iVar8 * lVar4);
      dVar19 = dVar19 + local_a8;
      dVar14 = dVar14 + dStack_a0;
      dVar18 = dVar18 + dVar13;
      dVar18 = (double)((ulong)dVar18 & -(ulong)(dVar18 != 0.0) |
                       ~-(ulong)(dVar18 != 0.0) & (ulong)(dVar13 + dVar18));
      buffer = buffer + 1;
    } while (buffer < puVar1);
  }
  return;
}

Assistant:

static void QT_FASTCALL fetchTransformed_fetcher(T *buffer, const QSpanData *data,
                                                 int y, int x, int length)
{
    static_assert(blendType == BlendTransformed || blendType == BlendTransformedTiled);
    const QTextureData &image = data->texture;

    const qreal cx = x + qreal(0.5);
    const qreal cy = y + qreal(0.5);

    constexpr bool useFetch = (bpp < QPixelLayout::BPP32) && sizeof(T) == sizeof(uint);
    const QPixelLayout *layout = &qPixelLayouts[data->texture.format];
    if (!useFetch)
        Q_ASSERT(layout->bpp == bpp || (layout->bpp == QPixelLayout::BPP16FPx4 && bpp == QPixelLayout::BPP64));
    // When templated 'fetch' should be inlined at compile time:
    const Fetch1PixelFunc fetch1 = (bpp == QPixelLayout::BPPNone) ? fetch1PixelTable[layout->bpp] : Fetch1PixelFunc(fetch1Pixel<bpp>);

    if (canUseFastMatrixPath(cx, cy, length, data)) {
        // The increment pr x in the scanline
        int fdx = (int)(data->m11 * fixed_scale);
        int fdy = (int)(data->m12 * fixed_scale);

        int fx = int((data->m21 * cy
                      + data->m11 * cx + data->dx) * fixed_scale);
        int fy = int((data->m22 * cy
                      + data->m12 * cx + data->dy) * fixed_scale);

        if (fdy == 0) { // simple scale, no rotation or shear
            int py = (fy >> 16);
            fetchTransformed_pixelBounds<blendType>(image.height, image.y1, image.y2 - 1, py);
            const uchar *src = image.scanLine(py);

            int i = 0;
            if (blendType == BlendTransformed) {
                int fastLen = length;
                if (fdx > 0)
                    fastLen = qMin(fastLen, int((qint64(image.x2 - 1) * fixed_scale - fx) / fdx));
                else if (fdx < 0)
                    fastLen = qMin(fastLen, int((qint64(image.x1) * fixed_scale - fx) / fdx));

                for (; i < fastLen; ++i) {
                    int x1 = (fx >> 16);
                    int x2 = x1;
                    fetchTransformed_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, x1);
                    if (x1 == x2)
                        break;
                    if constexpr (useFetch)
                        buffer[i] = fetch1(src, x1);
                    else
                        buffer[i] = reinterpret_cast<const T*>(src)[x1];
                    fx += fdx;
                }

                for (; i < fastLen; ++i) {
                    int px = (fx >> 16);
                    if constexpr (useFetch)
                        buffer[i] = fetch1(src, px);
                    else
                        buffer[i] = reinterpret_cast<const T*>(src)[px];
                    fx += fdx;
                }
            }

            for (; i < length; ++i) {
                int px = (fx >> 16);
                fetchTransformed_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, px);
                if constexpr (useFetch)
                    buffer[i] = fetch1(src, px);
                else
                    buffer[i] = reinterpret_cast<const T*>(src)[px];
                fx += fdx;
            }
        } else { // rotation or shear
            int i = 0;
            if (blendType == BlendTransformed) {
                int fastLen = length;
                if (fdx > 0)
                    fastLen = qMin(fastLen, int((qint64(image.x2 - 1) * fixed_scale - fx) / fdx));
                else if (fdx < 0)
                    fastLen = qMin(fastLen, int((qint64(image.x1) * fixed_scale - fx) / fdx));
                if (fdy > 0)
                    fastLen = qMin(fastLen, int((qint64(image.y2 - 1) * fixed_scale - fy) / fdy));
                else if (fdy < 0)
                    fastLen = qMin(fastLen, int((qint64(image.y1) * fixed_scale - fy) / fdy));

                for (; i < fastLen; ++i) {
                    int x1 = (fx >> 16);
                    int y1 = (fy >> 16);
                    int x2 = x1;
                    int y2 = y1;
                    fetchTransformed_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, x1);
                    fetchTransformed_pixelBounds<blendType>(image.height, image.y1, image.y2 - 1, y1);
                    if (x1 == x2 && y1 == y2)
                        break;
                    if constexpr (useFetch)
                        buffer[i] = fetch1(image.scanLine(y1), x1);
                    else
                        buffer[i] = reinterpret_cast<const T*>(image.scanLine(y1))[x1];
                    fx += fdx;
                    fy += fdy;
                }

                for (; i < fastLen; ++i) {
                    int px = (fx >> 16);
                    int py = (fy >> 16);
                    if constexpr (useFetch)
                        buffer[i] = fetch1(image.scanLine(py), px);
                    else
                        buffer[i] = reinterpret_cast<const T*>(image.scanLine(py))[px];
                    fx += fdx;
                    fy += fdy;
                }
            }

            for (; i < length; ++i) {
                int px = (fx >> 16);
                int py = (fy >> 16);
                fetchTransformed_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, px);
                fetchTransformed_pixelBounds<blendType>(image.height, image.y1, image.y2 - 1, py);
                if constexpr (useFetch)
                    buffer[i] = fetch1(image.scanLine(py), px);
                else
                    buffer[i] = reinterpret_cast<const T*>(image.scanLine(py))[px];
                fx += fdx;
                fy += fdy;
            }
        }
    } else {
        const qreal fdx = data->m11;
        const qreal fdy = data->m12;
        const qreal fdw = data->m13;

        qreal fx = data->m21 * cy + data->m11 * cx + data->dx;
        qreal fy = data->m22 * cy + data->m12 * cx + data->dy;
        qreal fw = data->m23 * cy + data->m13 * cx + data->m33;

        T *const end = buffer + length;
        T *b = buffer;
        while (b < end) {
            const qreal iw = fw == 0 ? 1 : 1 / fw;
            const qreal tx = fx * iw;
            const qreal ty = fy * iw;
            int px = qFloor(tx);
            int py = qFloor(ty);

            fetchTransformed_pixelBounds<blendType>(image.height, image.y1, image.y2 - 1, py);
            fetchTransformed_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, px);
            if constexpr (useFetch)
                *b = fetch1(image.scanLine(py), px);
            else
                *b = reinterpret_cast<const T*>(image.scanLine(py))[px];

            fx += fdx;
            fy += fdy;
            fw += fdw;
            //force increment to avoid /0
            if (!fw) {
                fw += fdw;
            }
            ++b;
        }
    }
}